

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datahashtable.h
# Opt level: O0

char * __thiscall
soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::index
          (DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *this,char *__s,int __c)

{
  int iVar1;
  int iVar2;
  Element<soplex::NameSet::Name,_soplex::DataKey> *pEVar3;
  uint uVar4;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  uint local_1c;
  uint local_4;
  
  if (this->m_used == 0) {
    local_4 = 0xffffffff;
  }
  else {
    iVar1 = (*this->m_hashfun)((Name *)__s);
    iVar2 = Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
            ::size((Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
                    *)0x19f7b9);
    uVar4 = iVar1 % iVar2;
    local_1c = uVar4;
    do {
      pEVar3 = Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
               ::operator[]((Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
                             *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
      if (pEVar3->stat == FREE) break;
      pEVar3 = Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
               ::operator[]((Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
                             *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
      if (pEVar3->stat == USED) {
        Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
        ::operator[]((Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
                      *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
        iVar2 = soplex::operator==((Name *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                                   (Name *)CONCAT44(in_stack_ffffffffffffffcc,
                                                    in_stack_ffffffffffffffc8));
        if (iVar2 != 0) {
          local_4 = local_1c;
          goto LAB_0019f85b;
        }
      }
      in_stack_ffffffffffffffd0 = local_1c + this->m_hashsize;
      iVar2 = Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
              ::size((Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
                      *)0x19f835);
      local_1c = in_stack_ffffffffffffffd0 % iVar2;
    } while (local_1c != uVar4);
    local_4 = 0xffffffff;
  }
LAB_0019f85b:
  return (char *)(ulong)local_4;
}

Assistant:

int index(const HashItem& h) const
   {
      if(m_used == 0)
         return -1;

      assert(m_elem.size() > 0);

      auto i = (*m_hashfun)(&h) % m_elem.size();
      auto j = i;

      while(m_elem[i].stat != Elem::FREE)
      {
         if((m_elem[i].stat == Elem::USED)
               && (m_elem[i].item == h))
            return i;

         i = (i + m_hashsize) % m_elem.size();

         if(i == j)
            break;
      }

      return -1;
   }